

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O0

Promise<int> __thiscall kj::anon_unknown_0::identity<int>(anon_unknown_0 *this,int *value)

{
  bool bVar1;
  undefined8 *puVar2;
  Coroutine<int> *this_00;
  int *piVar3;
  void *pvVar4;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  int *value_local;
  
  puVar2 = (undefined8 *)operator_new(0x268);
  *puVar2 = identity<int>;
  puVar2[1] = identity<int>;
  this_00 = (Coroutine<int> *)(puVar2 + 2);
  puVar2[0x4a] = value;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar2 + 0x47),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
             ,"identity",0x20,0x17);
  pvVar4 = (void *)puVar2[0x49];
  kj::_::Coroutine<int>::Coroutine(this_00,*(SourceLocation *)(puVar2 + 0x47));
  kj::_::Coroutine<int>::get_return_object((Coroutine<int> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar2 + 0x265));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar2 + 0x265));
    piVar3 = fwd<int>((NoInfer<int> *)puVar2[0x4a]);
    kj::_::CoroutineMixin<kj::_::Coroutine<int>,_int>::return_value
              ((CoroutineMixin<kj::_::Coroutine<int>,_int> *)this_00,*piVar3);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x266));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x266));
      kj::_::Coroutine<int>::~Coroutine(this_00);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x268);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)((long)puVar2 + 0x264) = 1;
      _GLOBAL__N_1::identity
                ((void *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),pvVar4);
    }
  }
  else {
    *(undefined1 *)((long)puVar2 + 0x264) = 0;
    _GLOBAL__N_1::identity
              ((void *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),pvVar4);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<kj::Decay<T>> identity(T&& value) {
  co_return kj::fwd<T>(value);
}